

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  string *this;
  allocator<char> local_d2;
  allocator<char> local_d1;
  FilePath result;
  FilePath output_name;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (FLAGS_gtest_output_abi_cxx11_ == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"",(allocator<char> *)&output_name);
  }
  else {
    pcVar1 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
    if (pcVar1 == (char *)0x0) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,(allocator<char> *)&local_30);
      FilePath::FilePath(&result,&local_90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"test_detail.xml",&local_d2);
      FilePath::FilePath((FilePath *)&local_70,&local_50);
      FilePath::ConcatPaths(&output_name,&result,(FilePath *)&local_70);
      std::__cxx11::string::string((string *)in_RDI,(string *)&output_name);
      std::__cxx11::string::~string((string *)&output_name);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&result);
      this = &local_90;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,pcVar1 + 1,(allocator<char> *)&local_90);
      FilePath::FilePath(&output_name,&result.pathname_);
      std::__cxx11::string::~string((string *)&result);
      if (*output_name.pathname_._M_dataplus._M_p != '/') {
        UnitTest::GetInstance();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                   _M_dataplus._M_p,&local_d2);
        FilePath::FilePath((FilePath *)&local_90,&local_70);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,pcVar1 + 1,&local_d1)
        ;
        FilePath::FilePath((FilePath *)&local_50,&local_30);
        FilePath::ConcatPaths(&result,(FilePath *)&local_90,(FilePath *)&local_50);
        std::__cxx11::string::_M_assign((string *)&output_name);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_30);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if ((output_name.pathname_._M_string_length == 0) ||
         (output_name.pathname_._M_dataplus._M_p[output_name.pathname_._M_string_length - 1] != '/')
         ) {
        std::__cxx11::string::string((string *)in_RDI,(string *)&output_name);
      }
      else {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        FilePath::GenerateUniqueFileName
                  (&result,&output_name,(FilePath *)&local_90,local_70._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string((string *)in_RDI,(string *)&result);
        std::__cxx11::string::~string((string *)&result);
      }
      this = &output_name.pathname_;
    }
    std::__cxx11::string::~string((string *)this);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::ConcatPaths(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile)).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}